

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalNinjaGenerator::OpenBuildFileStream(cmGlobalNinjaGenerator *this)

{
  bool bVar1;
  byte bVar2;
  cmake *this_00;
  string *psVar3;
  type pcVar4;
  ostream *poVar5;
  undefined1 local_51;
  undefined1 local_50 [32];
  string buildFilePath;
  cmGlobalNinjaGenerator *this_local;
  
  buildFilePath.field_2._8_8_ = this;
  this_00 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(this_00);
  std::__cxx11::string::string((string *)(local_50 + 0x18),(string *)psVar3);
  std::__cxx11::string::operator+=((string *)(local_50 + 0x18),"/");
  std::__cxx11::string::operator+=((string *)(local_50 + 0x18),NINJA_BUILD_FILE);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->BuildFileStream);
  if (!bVar1) {
    local_51 = None;
    (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[5])();
    std::make_unique<cmGeneratedFileStream,std::__cxx11::string&,bool,codecvt::Encoding>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               (bool *)(local_50 + 0x18),(Encoding *)&local_51);
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::operator=
              (&this->BuildFileStream,
               (unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
               local_50);
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::~unique_ptr
              ((unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
               local_50);
    pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->BuildFileStream);
    bVar2 = std::ios::operator!((ios *)((long)&(pcVar4->super_ofstream).
                                               super_basic_ostream<char,_std::char_traits<char>_>.
                                               _vptr_basic_ostream +
                                       (long)(pcVar4->super_ofstream).
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream[-3]));
    if ((bVar2 & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_003fd150;
    }
  }
  pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
           operator*(&this->BuildFileStream);
  WriteDisclaimer(this,(ostream *)pcVar4);
  pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
           operator*(&this->BuildFileStream);
  poVar5 = std::operator<<((ostream *)pcVar4,
                           "# This file contains all the build statements describing the\n");
  std::operator<<(poVar5,"# compilation DAG.\n\n");
  this_local._7_1_ = true;
LAB_003fd150:
  std::__cxx11::string::~string((string *)(local_50 + 0x18));
  return this_local._7_1_;
}

Assistant:

bool cmGlobalNinjaGenerator::OpenBuildFileStream()
{
  // Compute Ninja's build file path.
  std::string buildFilePath =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  buildFilePath += "/";
  buildFilePath += cmGlobalNinjaGenerator::NINJA_BUILD_FILE;

  // Get a stream where to generate things.
  if (!this->BuildFileStream) {
    this->BuildFileStream = cm::make_unique<cmGeneratedFileStream>(
      buildFilePath, false, this->GetMakefileEncoding());
    if (!(*this->BuildFileStream)) {
      // An error message is generated by the constructor if it cannot
      // open the file.
      return false;
    }
  }

  // Write the do not edit header.
  this->WriteDisclaimer(*this->BuildFileStream);

  // Write a comment about this file.
  *this->BuildFileStream
    << "# This file contains all the build statements describing the\n"
    << "# compilation DAG.\n\n";

  return true;
}